

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void pybind11::
     class_<kratos::EventTracingStmt,_std::shared_ptr<kratos::EventTracingStmt>,_kratos::AuxiliaryStmt>
     ::init_holder<kratos::Stmt>
               (instance *inst,value_and_holder *v_h,holder_type *param_3,
               enable_shared_from_this<kratos::Stmt> *param_4)

{
  bool bVar1;
  EventTracingStmt **ppEVar2;
  shared_ptr<kratos::EventTracingStmt> *psVar3;
  enable_shared_from_this<kratos::Stmt> *local_60;
  shared_ptr<kratos::Stmt> local_48;
  undefined1 local_38 [8];
  shared_ptr<kratos::EventTracingStmt> sh;
  enable_shared_from_this<kratos::Stmt> *param_3_local;
  holder_type *param_2_local;
  value_and_holder *v_h_local;
  instance *inst_local;
  
  sh.super___shared_ptr<kratos::EventTracingStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)param_4;
  ppEVar2 = pybind11::detail::value_and_holder::value_ptr<kratos::EventTracingStmt>(v_h);
  local_60 = (enable_shared_from_this<kratos::Stmt> *)0x0;
  if (*ppEVar2 != (EventTracingStmt *)0x0) {
    local_60 = &((*ppEVar2)->super_AuxiliaryStmt).super_Stmt.
                super_enable_shared_from_this<kratos::Stmt>;
  }
  pybind11::detail::try_get_shared_from_this<kratos::Stmt>((detail *)&local_48,local_60);
  std::dynamic_pointer_cast<kratos::EventTracingStmt,kratos::Stmt>
            ((shared_ptr<kratos::Stmt> *)local_38);
  std::shared_ptr<kratos::Stmt>::~shared_ptr(&local_48);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_38);
  if (bVar1) {
    psVar3 = pybind11::detail::value_and_holder::holder<std::shared_ptr<kratos::EventTracingStmt>>
                       (v_h);
    std::shared_ptr<kratos::EventTracingStmt>::shared_ptr
              (psVar3,(shared_ptr<kratos::EventTracingStmt> *)local_38);
    pybind11::detail::value_and_holder::set_holder_constructed(v_h,true);
  }
  bVar1 = pybind11::detail::value_and_holder::holder_constructed(v_h);
  if ((!bVar1) && ((inst->field_0x30 & 1) != 0)) {
    psVar3 = pybind11::detail::value_and_holder::holder<std::shared_ptr<kratos::EventTracingStmt>>
                       (v_h);
    ppEVar2 = pybind11::detail::value_and_holder::value_ptr<kratos::EventTracingStmt>(v_h);
    std::shared_ptr<kratos::EventTracingStmt>::shared_ptr<kratos::EventTracingStmt,void>
              (psVar3,*ppEVar2);
    pybind11::detail::value_and_holder::set_holder_constructed(v_h,true);
  }
  std::shared_ptr<kratos::EventTracingStmt>::~shared_ptr
            ((shared_ptr<kratos::EventTracingStmt> *)local_38);
  return;
}

Assistant:

static void init_holder(detail::instance *inst, detail::value_and_holder &v_h,
            const holder_type * /* unused */, const std::enable_shared_from_this<T> * /* dummy */) {

        auto sh = std::dynamic_pointer_cast<typename holder_type::element_type>(
                detail::try_get_shared_from_this(v_h.value_ptr<type>()));
        if (sh) {
            new (std::addressof(v_h.holder<holder_type>())) holder_type(std::move(sh));
            v_h.set_holder_constructed();
        }

        if (!v_h.holder_constructed() && inst->owned) {
            new (std::addressof(v_h.holder<holder_type>())) holder_type(v_h.value_ptr<type>());
            v_h.set_holder_constructed();
        }
    }